

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  char *__s;
  ostream *poVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  ostringstream *this_00;
  LogMessage local_1b0;
  
  lVar6 = (long)rewrite->length_;
  bVar5 = lVar6 < 1;
  if (0 < lVar6) {
    pcVar8 = rewrite->ptr_;
    pcVar7 = pcVar8 + lVar6;
    do {
      this_00 = &local_1b0.str_;
      if (*pcVar8 == '\\') {
        pcVar8 = pcVar8 + 1;
        iVar4 = -1;
        if (pcVar8 < pcVar7) {
          iVar4 = (int)*pcVar8;
        }
        uVar1 = iVar4 - 0x30;
        if (9 < uVar1) {
          if (iVar4 != 0x5c) {
            if ((this->options_).log_errors_ != true) {
              return bVar5;
            }
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x37e,2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"invalid rewrite pattern: ",0x19);
            pcVar8 = rewrite->ptr_;
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
            }
            else {
              sVar3 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar8,sVar3);
            }
            LogMessage::~LogMessage(&local_1b0);
            return bVar5;
          }
          goto LAB_001269af;
        }
        if ((int)uVar1 < veclen) {
          if (0 < vec[uVar1].length_) {
            std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].ptr_);
          }
        }
        else if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x372,2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"requested group ",0x10);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)this_00,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," in regexp ",0xb);
          __s = rewrite->ptr_;
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          }
          else {
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
          }
          LogMessage::~LogMessage(&local_1b0);
        }
        if (veclen <= (int)uVar1) {
          return bVar5;
        }
      }
      else {
LAB_001269af:
        std::__cxx11::string::push_back((char)out);
      }
      pcVar8 = pcVar8 + 1;
      bVar5 = pcVar8 >= pcVar7;
    } while (pcVar8 < pcVar7);
  }
  return bVar5;
}

Assistant:

bool RE2::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece *vec, int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "requested group " << n
                     << " in regexp " << rewrite.data();
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (snip.size() > 0)
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}